

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yangdata.c
# Opt level: O2

LY_ERR yangdata_compile(lysc_ctx *cctx,lysp_ext_instance *extp,lysc_ext_instance *ext)

{
  void **ppvVar1;
  uint16_t nodetype;
  uint32_t uVar2;
  lysc_ext_substmt *plVar3;
  lysc_node *parent;
  lysc_module *module;
  LY_ERR LVar4;
  uint32_t *puVar5;
  long *plVar6;
  ly_ctx *ctx;
  lysc_node *last;
  long lVar7;
  char *format;
  char *pcVar8;
  
  puVar5 = lyplg_ext_compile_get_options(cctx);
  uVar2 = *puVar5;
  plVar3 = ext->substmts;
  if (plVar3 == (lysc_ext_substmt *)0x0) {
    plVar6 = (long *)calloc(1,0x38);
    if (plVar6 == (long *)0x0) goto LAB_001953a2;
    lVar7 = 0;
  }
  else {
    plVar6 = (long *)realloc(&plVar3[-1].storage_p,(long)plVar3[-1].storage_p * 0x10 + 0x38);
    if (plVar6 == (long *)0x0) {
LAB_001953a2:
      lyplg_ext_compile_log
                (cctx,ext,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yangdata_compile");
      return LY_EMEM;
    }
    lVar7 = *plVar6;
  }
  ext->substmts = (lysc_ext_substmt *)(plVar6 + 1);
  plVar6[lVar7 * 2 + 5] = 0;
  (plVar6 + lVar7 * 2 + 5)[1] = 0;
  plVar6[lVar7 * 2 + 3] = 0;
  (plVar6 + lVar7 * 2 + 3)[1] = 0;
  plVar6[lVar7 * 2 + 1] = 0;
  (plVar6 + lVar7 * 2 + 1)[1] = 0;
  *(undefined4 *)(plVar6 + 1) = 0x400;
  ppvVar1 = &ext->compiled;
  plVar6[2] = (long)ppvVar1;
  *(undefined4 *)(plVar6 + 3) = 0x200;
  plVar6[4] = (long)ppvVar1;
  *plVar6 = *plVar6 + 3;
  *(undefined4 *)(plVar6 + 5) = 0x8000;
  plVar6[6] = (long)ppvVar1;
  puVar5 = lyplg_ext_compile_get_options(cctx);
  *(byte *)puVar5 = (byte)*puVar5 | 0xc;
  LVar4 = lyplg_ext_compile_extension_instance(cctx,extp,ext);
  puVar5 = lyplg_ext_compile_get_options(cctx);
  *puVar5 = uVar2;
  if (LVar4 == LY_SUCCESS) {
    parent = (lysc_node *)*ppvVar1;
    if (parent == (lysc_node *)0x0) {
      pcVar8 = extp->name;
      format = 
      "Extension %s is instantiated without any top level data node, but exactly one container data node is expected."
      ;
    }
    else if (parent->next == (lysc_node *)0x0) {
      nodetype = parent->nodetype;
      if (nodetype == 1) {
        return LY_SUCCESS;
      }
      if (nodetype == 2) {
        module = (lysc_module *)ext->parent;
        last = (lysc_node *)0x0;
        do {
          last = lys_getnext(last,parent,module,0);
          if (last == (lysc_node *)0x0) {
            return LY_SUCCESS;
          }
          if (last->next != (lysc_node *)0x0) {
            pcVar8 = extp->name;
            format = 
            "Extension %s is instantiated with multiple top level data nodes (inside a single choice\'s case), but only a single container data node is allowed."
            ;
            goto LAB_001953dd;
          }
        } while (last->nodetype == 1);
        pcVar8 = extp->name;
        lys_nodetype2str(last->nodetype);
        format = 
        "Extension %s is instantiated with %s top level data node (inside a choice), but only a single container data node is allowed."
        ;
      }
      else {
        pcVar8 = extp->name;
        lys_nodetype2str(nodetype);
        format = 
        "Extension %s is instantiated with %s top level data node, but only a single container data node is allowed."
        ;
      }
    }
    else {
      pcVar8 = extp->name;
      format = 
      "Extension %s is instantiated with multiple top level data nodes, but only a single container data node is allowed."
      ;
    }
LAB_001953dd:
    lyplg_ext_compile_log(cctx,ext,LY_LLERR,LY_EVALID,format,pcVar8);
    LVar4 = LY_EVALID;
    ctx = lyplg_ext_compile_get_ctx(cctx);
    yangdata_cfree(ctx,ext);
    ext->substmts = (lysc_ext_substmt *)0x0;
    ext->compiled = (void *)0x0;
  }
  return LVar4;
}

Assistant:

static LY_ERR
yangdata_compile(struct lysc_ctx *cctx, const struct lysp_ext_instance *extp, struct lysc_ext_instance *ext)
{
    LY_ERR ret;
    const struct lysc_node *child;
    ly_bool valid = 1;
    uint32_t prev_options = *lyplg_ext_compile_get_options(cctx);

    /* compile yangg-data substatements */
    LY_ARRAY_CREATE_GOTO(cctx->ctx, ext->substmts, 3, ret, emem);
    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[0].stmt = LY_STMT_CONTAINER;
    ext->substmts[0].storage_p = (void **)&ext->compiled;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[1].stmt = LY_STMT_CHOICE;
    ext->substmts[1].storage_p = (void **)&ext->compiled;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[2].stmt = LY_STMT_USES;
    ext->substmts[2].storage_p = (void **)&ext->compiled;

    *lyplg_ext_compile_get_options(cctx) |= LYS_COMPILE_NO_CONFIG | LYS_COMPILE_NO_DISABLED;
    ret = lyplg_ext_compile_extension_instance(cctx, extp, ext);
    *lyplg_ext_compile_get_options(cctx) = prev_options;
    if (ret) {
        return ret;
    }

    /* check that we have really just a single container data definition in the top */
    child = ext->compiled;
    if (!child) {
        valid = 0;
        lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                "Extension %s is instantiated without any top level data node, but exactly one container data node is expected.",
                extp->name);
    } else if (child->next) {
        valid = 0;
        lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                "Extension %s is instantiated with multiple top level data nodes, but only a single container data node is allowed.",
                extp->name);
    } else if (child->nodetype == LYS_CHOICE) {
        /* all the choice's case are expected to result to a single container node */
        struct lysc_module *mod_c = ext->parent;
        const struct lysc_node *snode = NULL;

        while ((snode = lys_getnext(snode, child, mod_c, 0))) {
            if (snode->next) {
                valid = 0;
                lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                        "Extension %s is instantiated with multiple top level data nodes (inside a single choice's case), "
                        "but only a single container data node is allowed.", extp->name);
                break;
            } else if (snode->nodetype != LYS_CONTAINER) {
                valid = 0;
                lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                        "Extension %s is instantiated with %s top level data node (inside a choice), "
                        "but only a single container data node is allowed.", extp->name, lys_nodetype2str(snode->nodetype));
                break;
            }
        }
    } else if (child->nodetype != LYS_CONTAINER) {
        /* via uses */
        valid = 0;
        lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                "Extension %s is instantiated with %s top level data node, but only a single container data node is allowed.",
                extp->name, lys_nodetype2str(child->nodetype));
    }

    if (!valid) {
        yangdata_cfree(lyplg_ext_compile_get_ctx(cctx), ext);
        ext->compiled = ext->substmts = NULL;
        return LY_EVALID;
    }

    return LY_SUCCESS;

emem:
    lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EMEM, "Memory allocation failed (%s()).", __func__);
    return LY_EMEM;
}